

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

int stbi__pic_is4(stbi__context *s,char *str)

{
  stbi_uc sVar1;
  int local_24;
  int i;
  char *str_local;
  stbi__context *s_local;
  
  local_24 = 0;
  while( true ) {
    if (3 < local_24) {
      return 1;
    }
    sVar1 = stbi__get8(s);
    if (sVar1 != str[local_24]) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static int stbi__pic_is4(stbi__context *s,const char *str)
{
   int i;
   for (i=0; i<4; ++i)
      if (stbi__get8(s) != (stbi_uc)str[i])
         return 0;

   return 1;
}